

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::SourceLineInfo::operator==(SourceLineInfo *this,SourceLineInfo *other)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  if (this->line != other->line) {
    return false;
  }
  __n = (this->file)._M_string_length;
  if (__n == (other->file)._M_string_length) {
    iVar1 = std::char_traits<char>::compare
                      ((this->file)._M_dataplus._M_p,(other->file)._M_dataplus._M_p,__n);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SourceLineInfo::operator == ( SourceLineInfo const& other ) const {
        return line == other.line && file == other.file;
    }